

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_file_errorfn(arg_file *parent,arg_dstr_t ds,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *pcVar1;
  char *datatype;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  pcVar1 = (parent->hdr).datatype;
  datatype = "";
  if (argval != (char *)0x0) {
    datatype = argval;
  }
  arg_dstr_catf(ds,"%s: ",progname);
  if (errorcode == 2) {
    arg_dstr_cat(ds,"excess option ");
  }
  else {
    if (errorcode != 1) {
      arg_dstr_catf(ds,"unknown error at \"%s\"\n",datatype);
      return;
    }
    arg_dstr_cat(ds,"missing option ");
    datatype = pcVar1;
  }
  arg_print_option_ds(ds,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_file_errorfn(struct arg_file* parent, arg_dstr_t ds, int errorcode, const char* argval, const char* progname) {
    const char* shortopts = parent->hdr.shortopts;
    const char* longopts = parent->hdr.longopts;
    const char* datatype = parent->hdr.datatype;

    /* make argval NULL safe */
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (errorcode) {
        case ARG_ERR_MINCOUNT:
            arg_dstr_cat(ds, "missing option ");
            arg_print_option_ds(ds, shortopts, longopts, datatype, "\n");
            break;

        case ARG_ERR_MAXCOUNT:
            arg_dstr_cat(ds, "excess option ");
            arg_print_option_ds(ds, shortopts, longopts, argval, "\n");
            break;

        default:
            arg_dstr_catf(ds, "unknown error at \"%s\"\n", argval);
    }
}